

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void __thiscall CTcGenTarg::write_sources_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  char *__s;
  uint16_t tmp;
  size_t buflen;
  uint16_t tmp_1;
  CTcTokFileDesc *pCVar1;
  char b [2];
  undefined2 local_2c;
  undefined2 local_2a;
  
  local_2a = (undefined2)G_tok->next_filedesc_id_;
  CVmFile::write_bytes(fp,(char *)&local_2a,2);
  pCVar1 = G_tok->desc_head_;
  if (pCVar1 != (CTcTokFileDesc *)0x0) {
    do {
      __s = pCVar1->fname_;
      buflen = strlen(__s);
      local_2c = (undefined2)buflen;
      CVmFile::write_bytes(fp,(char *)&local_2c,2);
      CVmFile::write_bytes(fp,__s,buflen);
      pCVar1 = pCVar1->next_;
    } while (pCVar1 != (CTcTokFileDesc *)0x0);
  }
  return;
}

Assistant:

void CTcGenTarg::write_sources_to_object_file(CVmFile *fp)
{
    CTcTokFileDesc *desc;

    /* write the number of entries */
    fp->write_uint2(G_tok->get_filedesc_count());

    /* write the entries */
    for (desc = G_tok->get_first_filedesc() ; desc != 0 ;
         desc = desc->get_next())
    {
        size_t len;
        const char *fname;

        /* get the filename - use the resolved local filename */
        fname = desc->get_fname();

        /* write the length of the filename */
        len = strlen(fname);
        fp->write_uint2(len);

        /* write the filename */
        fp->write_bytes(fname, len);
    }
}